

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine2d.c
# Opt level: O0

void glmc_rotate2d_to(vec3 *m,float angle,vec3 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar7;
  float fVar8;
  float s;
  float c;
  float m12;
  float m02;
  float m11;
  float m01;
  float m10;
  float m00;
  
  fVar1 = *in_RDI;
  fVar2 = in_RDI[3];
  fVar3 = in_RDI[1];
  fVar4 = in_RDI[4];
  fVar5 = in_RDI[2];
  fVar6 = in_RDI[5];
  fVar7 = sinf(in_XMM0_Da);
  fVar8 = cosf(in_XMM0_Da);
  *in_RSI = fVar1 * fVar8 + fVar2 * fVar7;
  in_RSI[1] = fVar3 * fVar8 + fVar4 * fVar7;
  in_RSI[2] = fVar5 * fVar8 + fVar6 * fVar7;
  in_RSI[3] = fVar1 * -fVar7 + fVar2 * fVar8;
  in_RSI[4] = fVar3 * -fVar7 + fVar4 * fVar8;
  in_RSI[5] = fVar5 * -fVar7 + fVar6 * fVar8;
  in_RSI[6] = in_RDI[6];
  in_RSI[7] = in_RDI[7];
  in_RSI[8] = in_RDI[8];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate2d_to(mat3 m, float angle, mat3 dest) {
  glm_rotate2d_to(m, angle, dest);
}